

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O3

int TIFFInitLZW(TIFF *tif,int scheme)

{
  uint8_t *puVar1;
  
  if (scheme == 5) {
    puVar1 = (uint8_t *)_TIFFmallocExt(tif,0x128);
    tif->tif_data = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      TIFFErrorExtR(tif,"TIFFInitLZW","No space for LZW state block");
    }
    else {
      puVar1[0xe8] = '\0';
      puVar1[0xe9] = '\0';
      puVar1[0xea] = '\0';
      puVar1[0xeb] = '\0';
      puVar1[0xec] = '\0';
      puVar1[0xed] = '\0';
      puVar1[0xee] = '\0';
      puVar1[0xef] = '\0';
      puVar1[0xc0] = '\0';
      puVar1[0xc1] = '\0';
      puVar1[0xc2] = '\0';
      puVar1[0xc3] = '\0';
      puVar1[0xc4] = '\0';
      puVar1[0xc5] = '\0';
      puVar1[0xc6] = '\0';
      puVar1[199] = '\0';
      puVar1[0x120] = '\0';
      puVar1[0x121] = '\0';
      puVar1[0x122] = '\0';
      puVar1[0x123] = '\0';
      puVar1[0x124] = '\0';
      puVar1[0x125] = '\0';
      puVar1[0x126] = '\0';
      puVar1[0x127] = '\0';
      *(int *)(puVar1 + 0x98) = tif->tif_mode;
      tif->tif_fixuptags = LZWFixupTags;
      tif->tif_setupdecode = LZWSetupDecode;
      tif->tif_predecode = LZWPreDecode;
      tif->tif_decoderow = LZWDecode;
      tif->tif_decodestrip = LZWDecode;
      tif->tif_decodetile = LZWDecode;
      tif->tif_setupencode = LZWSetupEncode;
      tif->tif_preencode = LZWPreEncode;
      tif->tif_postencode = LZWPostEncode;
      tif->tif_encoderow = LZWEncode;
      tif->tif_encodestrip = LZWEncode;
      tif->tif_encodetile = LZWEncode;
      tif->tif_cleanup = LZWCleanup;
      TIFFPredictorInit(tif);
    }
    return (uint)(puVar1 != (uint8_t *)0x0);
  }
  __assert_fail("scheme == COMPRESSION_LZW",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                ,0x578,"int TIFFInitLZW(TIFF *, int)");
}

Assistant:

int TIFFInitLZW(TIFF *tif, int scheme)
{
    static const char module[] = "TIFFInitLZW";
    (void)scheme;
    assert(scheme == COMPRESSION_LZW);
    /*
     * Allocate state block so tag methods have storage to record values.
     */
    tif->tif_data = (uint8_t *)_TIFFmallocExt(tif, sizeof(LZWCodecState));
    if (tif->tif_data == NULL)
        goto bad;
    DecoderState(tif)->dec_codetab = NULL;
    DecoderState(tif)->dec_decode = NULL;
    EncoderState(tif)->enc_hashtab = NULL;
    LZWState(tif)->rw_mode = tif->tif_mode;

    /*
     * Install codec methods.
     */
    tif->tif_fixuptags = LZWFixupTags;
    tif->tif_setupdecode = LZWSetupDecode;
    tif->tif_predecode = LZWPreDecode;
    tif->tif_decoderow = LZWDecode;
    tif->tif_decodestrip = LZWDecode;
    tif->tif_decodetile = LZWDecode;
    tif->tif_setupencode = LZWSetupEncode;
    tif->tif_preencode = LZWPreEncode;
    tif->tif_postencode = LZWPostEncode;
    tif->tif_encoderow = LZWEncode;
    tif->tif_encodestrip = LZWEncode;
    tif->tif_encodetile = LZWEncode;
    tif->tif_cleanup = LZWCleanup;
    /*
     * Setup predictor setup.
     */
    (void)TIFFPredictorInit(tif);
    return (1);
bad:
    TIFFErrorExtR(tif, module, "No space for LZW state block");
    return (0);
}